

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void google::protobuf::internal::PackedFieldHelper<2>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  float fVar1;
  undefined8 in_RAX;
  float *pfVar2;
  int index;
  RepeatedField<float> *array;
  uint32_t local_28;
  undefined4 local_24;
  
  if (*field != 0) {
    _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),md->tag);
    PrimitiveTypeHelper<13>::Serialize(&local_28,output);
    _local_28 = CONCAT44(*(undefined4 *)((long)field + 0x10),local_28);
    PrimitiveTypeHelper<13>::Serialize(&local_24,output);
    if (0 < *field) {
      index = 0;
      do {
        pfVar2 = RepeatedField<float>::Get((RepeatedField<float> *)field,index);
        fVar1 = *pfVar2;
        pfVar2 = (float *)output->cur_;
        if ((output->impl_).end_ <= pfVar2) {
          pfVar2 = (float *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                      (&output->impl_,(uint8_t *)pfVar2);
        }
        *pfVar2 = fVar1;
        output->cur_ = (uint8_t *)(pfVar2 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}